

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O1

void place_trap(chunk *c,loc grid,wchar_t t_idx,wchar_t trap_level)

{
  bitflag *flags;
  short sVar1;
  ushort uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  level_conflict *plVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  trap_kind_conflict *ptVar8;
  trap_kind_conflict *ptVar9;
  _Bool _Var10;
  wchar_t wVar11;
  uint32_t uVar12;
  int iVar13;
  square *psVar14;
  void *p;
  trap *trap;
  trap *ptVar15;
  long lVar16;
  wchar_t wVar17;
  ulong uVar18;
  random_value v;
  
  if ((t_idx < L'\x01') || ((int)(uint)z_info->trap_max <= t_idx)) {
    _Var10 = square_player_trap_allowed(c,grid);
    if (!_Var10) {
      return;
    }
    psVar14 = square((chunk_conflict *)c,grid);
    wVar17 = (wchar_t)psVar14->feat;
    _Var10 = feat_is_trap_holding(wVar17);
    t_idx = L'\xffffffff';
    if ((_Var10) && (c->depth != L'\0')) {
      p = mem_zalloc((ulong)z_info->trap_max << 2);
      if (z_info->trap_max == 0) {
        uVar12 = 0;
      }
      else {
        uVar18 = 0;
        lVar16 = 0x68;
        uVar12 = 0;
        do {
          ptVar8 = trap_info;
          *(uint32_t *)((long)p + uVar18 * 4) = uVar12;
          if ((*(long *)((long)ptVar8 + lVar16 + -0x68) != 0) &&
             (*(int *)((long)ptVar8 + lVar16 + -0x1c) != 0)) {
            flags = ptVar8->flags + lVar16 + -0x68;
            _Var10 = flag_has_dbg(flags,3,2,"kind->flags","TRF_TRAP");
            if ((((_Var10) && (*(wchar_t *)(ptVar8->flags + lVar16 + -0x80) <= trap_level)) &&
                (((_Var10 = feat_is_tree(wVar17), !_Var10 ||
                  (_Var10 = flag_has_dbg(flags,3,6,"kind->flags","TRF_TREE"), _Var10)) &&
                 ((_Var10 = feat_is_floor(wVar17), !_Var10 ||
                  (_Var10 = flag_has_dbg(flags,3,5,"kind->flags","TRF_FLOOR"), _Var10)))))) &&
               ((wVar11 = level_topography((int)player->place), wVar11 == L'\a' ||
                (_Var10 = flag_has_dbg(flags,3,4,"kind->flags","TRF_DUNGEON"), !_Var10)))) {
              _Var10 = flag_has_dbg(flags,3,7,"kind->flags","TRF_DOWN");
              if (_Var10) {
                sVar1 = player->place;
                plVar5 = world->levels;
                _Var10 = quest_forbid_downstairs((int)sVar1);
                if ((_Var10) ||
                   (((plVar5[(int)sVar1].down == (char *)0x0 &&
                     (_Var10 = underworld_possible(plVar5[(int)sVar1].index), !_Var10)) ||
                    ((player->opts).opt[0x2a] != false)))) goto LAB_001d30a9;
              }
              uVar12 = (int)(100 / (long)*(int *)((long)ptVar8 + lVar16 + -0x1c)) +
                       *(int *)((long)p + uVar18 * 4);
              *(uint32_t *)((long)p + uVar18 * 4) = uVar12;
            }
          }
LAB_001d30a9:
          uVar18 = uVar18 + 1;
          lVar16 = lVar16 + 0x88;
        } while (uVar18 < z_info->trap_max);
      }
      if (uVar12 == 0) {
        mem_free(p);
      }
      else {
        uVar12 = Rand_div(uVar12);
        uVar2 = z_info->trap_max;
        wVar17 = (wchar_t)uVar2;
        if (uVar2 == 0) {
          wVar17 = L'\0';
        }
        else {
          uVar18 = 0;
          do {
            if ((int)uVar12 < *(int *)((long)p + uVar18 * 4)) {
              wVar17 = (wchar_t)uVar18;
              break;
            }
            uVar18 = uVar18 + 1;
          } while (uVar2 != uVar18);
        }
        mem_free(p);
        t_idx = L'\xffffffff';
        if ((uint)wVar17 < (uint)z_info->trap_max) {
          t_idx = wVar17;
        }
      }
    }
  }
  if ((L'\xffffffff' < t_idx) &&
     (((player == (player *)0x0 || (player->upkeep == (player_upkeep *)0x0)) ||
      ((player->upkeep->arena_level != true ||
       (_Var10 = flag_has_dbg(trap_info[(uint)t_idx].flags,3,7,"trap_info[t_idx].flags","TRF_DOWN"),
       !_Var10)))))) {
    trap = (trap *)mem_zalloc(0x28);
    ptVar15 = square_trap((chunk_conflict *)c,grid);
    trap->next = ptVar15;
    square_set_trap((chunk_conflict *)c,grid,trap);
    trap->t_idx = (uint8_t)t_idx;
    ptVar9 = trap_info;
    trap->kind = (trap_kind *)(trap_info + (uint)t_idx);
    trap->grid = grid;
    ptVar8 = ptVar9 + (uint)t_idx;
    uVar3 = (ptVar8->power).base;
    uVar6 = (ptVar8->power).dice;
    v.dice = uVar6;
    v.base = uVar3;
    ptVar9 = ptVar9 + (uint)t_idx;
    uVar4 = (ptVar9->power).sides;
    uVar7 = (ptVar9->power).m_bonus;
    v.m_bonus = uVar7;
    v.sides = uVar4;
    iVar13 = randcalc(v,trap_level,RANDOMISE);
    trap->power = (uint8_t)iVar13;
    flag_copy(trap->flags,trap_info[(uint)t_idx].flags,3);
    _Var10 = flag_has_dbg(trap->flags,3,0x10,"new_trap->flags","TRF_M_TRAP");
    if (_Var10) {
      player->num_traps = player->num_traps + '\x01';
    }
    psVar14 = square((chunk_conflict *)c,grid);
    flag_on_dbg(psVar14->info,3,9,"square(c, grid)->info","SQUARE_TRAP");
    square_note_spot(c,grid);
    square_light_spot(c,grid);
    return;
  }
  return;
}

Assistant:

void place_trap(struct chunk *c, struct loc grid, int t_idx, int trap_level)
{
	struct trap *new_trap;

	/* We've been called with an illegal index; choose a random trap */
	if ((t_idx <= 0) || (t_idx >= z_info->trap_max)) {
		/* Require the correct terrain */
		if (!square_player_trap_allowed(c, grid)) return;

		t_idx = pick_trap(c, square(c, grid)->feat, trap_level);
	}

	/* Failure */
	if (t_idx < 0) return;
	/* Don't allow trap doors in single combat arenas. */
	if (player && player->upkeep && player->upkeep->arena_level
			&& trf_has(trap_info[t_idx].flags, TRF_DOWN)) {
		return;
	}

	/* Allocate a new trap for this grid (at the front of the list) */
	new_trap = mem_zalloc(sizeof(*new_trap));
	new_trap->next = square_trap(c, grid);
	square_set_trap(c, grid, new_trap);

	/* Set the details */
	new_trap->t_idx = t_idx;
	new_trap->kind = &trap_info[t_idx];
	new_trap->grid = grid;
	new_trap->power = randcalc(new_trap->kind->power, trap_level, RANDOMISE);
	trf_copy(new_trap->flags, trap_info[t_idx].flags);

	/* We created a monster trap */
	if (trf_has(new_trap->flags, TRF_M_TRAP)) {
		player->num_traps++;
	}

	/* Toggle on the trap marker */
	sqinfo_on(square(c, grid)->info, SQUARE_TRAP);

	/* Redraw the grid */
	square_note_spot(c, grid);
	square_light_spot(c, grid);
}